

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Frame.cpp
# Opt level: O0

void __thiscall Frame::Frame(Frame *this,size_t length,void *data)

{
  bool bVar1;
  uchar *__p;
  pointer puVar2;
  size_t local_30;
  void *data_local;
  size_t length_local;
  Frame *this_local;
  
  __p = (uchar *)operator_new__(length);
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<unsigned_char*,std::default_delete<unsigned_char[]>,void,bool>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)this,__p);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this);
  local_30 = length;
  if (!bVar1) {
    local_30 = 0;
  }
  this->m_Size = local_30;
  puVar2 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                     (&this->m_Data);
  this->m_Pos = puVar2 + this->m_Size;
  this->m_OriginalSize = this->m_Size;
  if ((this->m_Pos != (uint8_t *)0x0) && (data != (void *)0x0)) {
    this->m_Pos = this->m_Pos + -length;
    memcpy(this->m_Pos,data,length);
  }
  return;
}

Assistant:

Frame::Frame(size_t length, const void* data)
    : m_Data(new uint8_t[length])
{
    m_Size = m_Data ? length : 0;
    m_Pos = m_Data.get() + m_Size;
    m_OriginalSize = m_Size;

    if (m_Pos && data) {
        m_Pos -= length;
        memcpy(m_Pos, data, length);
    }
}